

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_example.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::ApiExample::OnSubscriptionStatus
          (ApiExample *this,shared_ptr<bidfx_public_api::SubscriptionStatusEvent> *event)

{
  element_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  SubscriptionStatus local_34;
  Subject local_30 [24];
  shared_ptr<bidfx_public_api::SubscriptionStatusEvent> *local_18;
  shared_ptr<bidfx_public_api::SubscriptionStatusEvent> *event_local;
  ApiExample *this_local;
  
  local_18 = event;
  event_local = (shared_ptr<bidfx_public_api::SubscriptionStatusEvent> *)this;
  this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->logger_);
  std::
  __shared_ptr_access<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)event);
  bidfx_public_api::SubscriptionStatusEvent::GetSubject();
  std::
  __shared_ptr_access<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)event);
  local_34 = bidfx_public_api::SubscriptionStatusEvent::GetStatus();
  std::
  __shared_ptr_access<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)event);
  bidfx_public_api::SubscriptionStatusEvent::GetExplanation_abi_cxx11_();
  spdlog::logger::
  info<bidfx_public_api::price::subject::Subject,bidfx_public_api::SubscriptionStatus,std::__cxx11::string>
            (this_00,"Subscription Status Update: {} -> {}: {}",local_30,&local_34,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  price::subject::Subject::~Subject(local_30);
  return;
}

Assistant:

void ApiExample::OnSubscriptionStatus(std::shared_ptr<SubscriptionStatusEvent> event)
{
    logger_->info("Subscription Status Update: {} -> {}: {}", event->GetSubject(), event->GetStatus(), event->GetExplanation());
}